

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transpose.h
# Opt level: O0

void Eigen::internal::
     inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
               (Matrix<double,__1,__1,_0,__1,__1> *m)

{
  Matrix<double,__1,__1,_0,__1,__1> *this;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDI;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffffa8;
  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *other;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_ffffffffffffffb8;
  TriangularViewImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U,_Eigen::Dense>
  *in_stack_ffffffffffffffc0;
  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_30 [24];
  non_const_type local_18;
  MatrixTypeNested local_10;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_8;
  
  local_8 = in_RDI;
  this = (Matrix<double,__1,__1,_0,__1,__1> *)
         PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                   ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x152b93);
  pMVar1 = (Matrix<double,__1,__1,_0,__1,__1> *)
           PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                     ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x152ba2);
  if (this == pMVar1) {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrix(local_8);
    local_10 = (MatrixTypeNested)
               MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::triangularView<10u>
                         ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          in_stack_ffffffffffffffa8);
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrix(local_8);
    local_18 = (non_const_type)
               DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                         (in_stack_ffffffffffffffa8);
    TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>,10u,Eigen::Dense>::
    swap<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(in_stack_ffffffffffffffa8);
    other = local_30;
    DenseBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::eval
              ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               in_stack_ffffffffffffffb8);
    Matrix<double,-1,-1,0,-1,-1>::operator=(this,other);
    Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_1,__1,__1> *)0x152c2a);
  }
  return;
}

Assistant:

static void run(MatrixType& m) {
    if (m.rows()==m.cols())
      m.matrix().template triangularView<StrictlyUpper>().swap(m.matrix().transpose());
    else
      m = m.transpose().eval();
  }